

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2_debug_state.c
# Opt level: O3

void append_header_table_chunks
               (h2o_mem_pool_t *pool,h2o_iovec_vector_t *chunks,
               h2o_hpack_header_table_t *header_table)

{
  size_t *psVar1;
  size_t sVar2;
  h2o_iovec_t *phVar3;
  h2o_iovec_t *phVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar2 = header_table->num_entries;
  if (sVar2 != 0) {
    uVar6 = 0;
    do {
      uVar5 = (header_table->entry_start_index + uVar6) % header_table->entry_capacity;
      phVar3 = header_table->entries[uVar5].name;
      if (phVar3 == (h2o_iovec_t *)0x0) {
        __assert_fail("entry->name != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/http2_internal.h"
                      ,500,
                      "h2o_hpack_header_table_entry_t *h2o_hpack_header_table_get(h2o_hpack_header_table_t *, size_t)"
                     );
      }
      phVar4 = header_table->entries[uVar5].value;
      append_chunk(pool,chunks,"\n      [ \"%.*s\", \"%.*s\" ],",(ulong)(uint)phVar3->len,
                   phVar3->base,(ulong)(uint)phVar4->len,phVar4->base);
      uVar6 = uVar6 + 1;
    } while (uVar6 < header_table->num_entries);
    if (sVar2 != 0) {
      psVar1 = &chunks->entries[chunks->size - 1].len;
      *psVar1 = *psVar1 - 1;
    }
  }
  return;
}

Assistant:

static void append_header_table_chunks(h2o_mem_pool_t *pool, h2o_iovec_vector_t *chunks, h2o_hpack_header_table_t *header_table)
{
    int i;
    for (i = 0; i < header_table->num_entries; i++) {
        h2o_hpack_header_table_entry_t *entry = h2o_hpack_header_table_get(header_table, i);
        append_chunk(pool, chunks, "\n"
                                   "      [ \"%.*s\", \"%.*s\" ],",
                     (int)entry->name->len, entry->name->base, (int)entry->value->len, entry->value->base);
    }

    if (i > 0) {
        // remove the last commna
        --chunks->entries[chunks->size - 1].len;
    }
}